

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<unsigned_char> * __thiscall
kj::ArrayBuilder<unsigned_char>::operator=
          (ArrayBuilder<unsigned_char> *this,ArrayBuilder<unsigned_char> *other)

{
  RemoveConst<unsigned_char> *pRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  pRVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (uchar *)0x0;
  other->pos = (RemoveConst<unsigned_char> *)0x0;
  other->endPtr = (uchar *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }